

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChSurfaceNurbs::ChSurfaceNurbs(ChSurfaceNurbs *this)

{
  ChMatrixDynamic<ChVector<>_> mpoints;
  DenseStorage<chrono::ChVector<double>,__1,__1,__1,_1> local_28;
  
  (this->super_ChSurface).wireframe = false;
  (this->super_ChSurface).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChSurfaceNurbs_00b676c8;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (ChVector<double> *)0x0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  local_28._0_16_ = ZEXT416(0) << 0x40;
  local_28.m_cols = 0;
  Eigen::DenseStorage<chrono::ChVector<double>,_-1,_-1,_-1,_1>::resize(&local_28,4,2,2);
  if ((0 < local_28.m_rows) && (0 < local_28.m_cols)) {
    (local_28.m_data)->m_data[0] = -1.0;
    (local_28.m_data)->m_data[1] = -1.0;
    (local_28.m_data)->m_data[2] = 0.0;
    if (local_28.m_rows != 1) {
      local_28.m_data[local_28.m_cols].m_data[0] = 1.0;
      local_28.m_data[local_28.m_cols].m_data[1] = -1.0;
      local_28.m_data[local_28.m_cols].m_data[2] = 0.0;
      if (local_28.m_cols != 1) {
        local_28.m_data[1].m_data[0] = -1.0;
        local_28.m_data[1].m_data[1] = 1.0;
        local_28.m_data[1].m_data[2] = 0.0;
        local_28.m_data[local_28.m_cols + 1].m_data[0] = 1.0;
        local_28.m_data[local_28.m_cols + 1].m_data[1] = 1.0;
        local_28.m_data[local_28.m_cols + 1].m_data[2] = 0.0;
        (*(this->super_ChSurface).super_ChGeometry._vptr_ChGeometry[0xf])(this,1,1,&local_28,0,0,0);
        if (local_28.m_data != (ChVector<double> *)0x0) {
          free((void *)local_28.m_data[-1].m_data[2]);
        }
        return;
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<>, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<chrono::ChVector<>, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

ChSurfaceNurbs::ChSurfaceNurbs() {
    ChMatrixDynamic<ChVector<>> mpoints(2, 2);
    mpoints(0, 0) = ChVector<>(-1, -1, 0);
    mpoints(1, 0) = ChVector<>(1, -1, 0);
    mpoints(0, 1) = ChVector<>(-1, 1, 0);
    mpoints(1, 1) = ChVector<>(1, 1, 0);
    this->SetupData(1, 1, mpoints);
}